

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

bool __thiscall
testing::internal::DefaultDeathTestFactory::Create
          (DefaultDeathTestFactory *this,char *statement,
          Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *matcher,char *file,int line,DeathTest **test)

{
  size_type *psVar1;
  InternalRunDeathTestFlag *pIVar2;
  int iVar3;
  long *plVar4;
  ExecDeathTest *this_00;
  undefined8 *puVar5;
  NoExecDeathTest *this_01;
  long *plVar6;
  ulong *puVar7;
  bool bVar8;
  ulong uVar9;
  undefined8 uVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  int death_test_index;
  int local_12c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  string local_c8;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  int local_84;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_80;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_68;
  string local_50;
  
  UnitTest::GetInstance();
  pIVar2 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  iVar3 = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).death_test_count_;
  local_12c = iVar3 + 1;
  ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).death_test_count_ =
       local_12c;
  if (pIVar2 == (InternalRunDeathTestFlag *)0x0) {
LAB_00129529:
    iVar3 = std::__cxx11::string::compare(FLAGS_gtest_death_test_style_abi_cxx11_);
    if (iVar3 == 0) {
      this_00 = (ExecDeathTest *)operator_new(0x50);
      local_68.
      super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (matcher->
                super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                ).impl_.
                super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_68.
      super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (matcher->
           super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           ).impl_.
           super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      (matcher->
      super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ).impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (matcher->
      super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ).impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_68.
      super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0014f6c8;
      ExecDeathTest::ExecDeathTest(this_00,statement,&local_68,file,line);
      *test = (DeathTest *)this_00;
      local_68.
      super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0014f980;
      this_02._M_pi =
           local_68.
           super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           .impl_.
           super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
    }
    else {
      iVar3 = std::__cxx11::string::compare(FLAGS_gtest_death_test_style_abi_cxx11_);
      if (iVar3 != 0) {
        std::operator+(&local_128,"Unknown death test style \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       FLAGS_gtest_death_test_style_abi_cxx11_);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_f8 = *plVar6;
          lStack_f0 = plVar4[3];
          local_108 = &local_f8;
        }
        else {
          local_f8 = *plVar6;
          local_108 = (long *)*plVar4;
        }
        local_100 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
        if (local_108 != &local_f8) {
          operator_delete(local_108,local_f8 + 1);
        }
        local_50.field_2._M_allocated_capacity = local_128.field_2._M_allocated_capacity;
        local_50._M_dataplus._M_p = local_128._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) goto LAB_001299cb;
        goto LAB_001299d3;
      }
      this_01 = (NoExecDeathTest *)operator_new(0x40);
      local_80.
      super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (matcher->
                super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                ).impl_.
                super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      local_80.
      super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (matcher->
           super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           ).impl_.
           super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      (matcher->
      super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ).impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (matcher->
      super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ).impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_80.
      super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0014f6c8;
      NoExecDeathTest::NoExecDeathTest(this_01,statement,&local_80);
      *test = (DeathTest *)this_01;
      local_80.
      super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0014f980;
      this_02._M_pi =
           local_80.
           super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           .impl_.
           super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
    }
    bVar8 = true;
    if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
    }
  }
  else {
    if (iVar3 < pIVar2->index_) {
      iVar3 = std::__cxx11::string::compare((char *)pIVar2);
      if (((iVar3 != 0) || (pIVar2->line_ != line)) || (pIVar2->index_ != local_12c)) {
        *test = (DeathTest *)0x0;
        return true;
      }
      goto LAB_00129529;
    }
    StreamableToString<int>(&local_50,&local_12c);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x13d853);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_98 = *plVar6;
      lStack_90 = plVar4[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar6;
      local_a8 = (long *)*plVar4;
    }
    local_a0 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_a8);
    puVar7 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar7) {
      local_d8 = *puVar7;
      lStack_d0 = plVar4[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *puVar7;
      local_e8 = (ulong *)*plVar4;
    }
    local_e0 = plVar4[1];
    *plVar4 = (long)puVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_84 = pIVar2->index_;
    StreamableToString<int>(&local_c8,&local_84);
    uVar9 = 0xf;
    if (local_e8 != &local_d8) {
      uVar9 = local_d8;
    }
    if (uVar9 < local_c8._M_string_length + local_e0) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        uVar10 = local_c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < local_c8._M_string_length + local_e0) goto LAB_00129782;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_00129782:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_c8._M_dataplus._M_p);
    }
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    psVar1 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar1) {
      local_128.field_2._M_allocated_capacity = *psVar1;
      local_128.field_2._8_8_ = puVar5[3];
    }
    else {
      local_128.field_2._M_allocated_capacity = *psVar1;
      local_128._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_128._M_string_length = puVar5[1];
    *puVar5 = psVar1;
    puVar5[1] = 0;
    *(undefined1 *)psVar1 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_128);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_f8 = *plVar6;
      lStack_f0 = plVar4[3];
      local_108 = &local_f8;
    }
    else {
      local_f8 = *plVar6;
      local_108 = (long *)*plVar4;
    }
    local_100 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_001299cb:
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
LAB_001299d3:
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool DefaultDeathTestFactory::Create(const char* statement,
                                     Matcher<const std::string&> matcher,
                                     const char* file, int line,
                                     DeathTest** test) {
  UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const int death_test_index = impl->current_test_info()
      ->increment_death_test_count();

  if (flag != nullptr) {
    if (death_test_index > flag->index()) {
      DeathTest::set_last_death_test_message(
          "Death test count (" + StreamableToString(death_test_index)
          + ") somehow exceeded expected maximum ("
          + StreamableToString(flag->index()) + ")");
      return false;
    }

    if (!(flag->file() == file && flag->line() == line &&
          flag->index() == death_test_index)) {
      *test = nullptr;
      return true;
    }
  }

# if GTEST_OS_WINDOWS

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new WindowsDeathTest(statement, std::move(matcher), file, line);
  }

# elif GTEST_OS_FUCHSIA

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new FuchsiaDeathTest(statement, std::move(matcher), file, line);
  }

# else

  if (GTEST_FLAG(death_test_style) == "threadsafe") {
    *test = new ExecDeathTest(statement, std::move(matcher), file, line);
  } else if (GTEST_FLAG(death_test_style) == "fast") {
    *test = new NoExecDeathTest(statement, std::move(matcher));
  }

# endif  // GTEST_OS_WINDOWS

  else {  // NOLINT - this is more readable than unbalanced brackets inside #if.
    DeathTest::set_last_death_test_message(
        "Unknown death test style \"" + GTEST_FLAG(death_test_style)
        + "\" encountered");
    return false;
  }